

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::sampler_parameteri(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  allocator<char> local_2d;
  GLuint sampler;
  string local_28;
  
  sampler = 0;
  glu::CallLogWrapper::glGenSamplers(&ctx->super_CallLogWrapper,1,&sampler);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "GL_INVALID_OPERATION is generated if sampler is not the name of a sampler object previously returned from a call to ctx.glGenSamplers."
             ,&local_2d);
  NegativeTestContext::beginSection(ctx,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  glu::CallLogWrapper::glSamplerParameteri(&ctx->super_CallLogWrapper,0xffffffff,0x2802,0x812f);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "GL_INVALID_ENUM is generated if params should have a defined constant value (based on the value of pname) and does not."
             ,&local_2d);
  NegativeTestContext::beginSection(ctx,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  glu::CallLogWrapper::glSamplerParameteri(&ctx->super_CallLogWrapper,sampler,0x2802,-1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,
               "GL_INVALID_ENUM is generated if glSamplerParameteri is called for a non-scalar parameter."
               ,&local_2d);
    NegativeTestContext::beginSection(ctx,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    glu::CallLogWrapper::glSamplerParameteri(&ctx->super_CallLogWrapper,sampler,0x1004,0);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
  }
  glu::CallLogWrapper::glDeleteSamplers(&ctx->super_CallLogWrapper,1,&sampler);
  return;
}

Assistant:

void sampler_parameteri (NegativeTestContext& ctx)
{
	GLuint sampler = 0;

	ctx.glGenSamplers(1, &sampler);

	ctx.beginSection("GL_INVALID_OPERATION is generated if sampler is not the name of a sampler object previously returned from a call to ctx.glGenSamplers.");
	ctx.glSamplerParameteri(-1, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if params should have a defined constant value (based on the value of pname) and does not.");
	ctx.glSamplerParameteri(sampler, GL_TEXTURE_WRAP_S, -1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		ctx.beginSection("GL_INVALID_ENUM is generated if glSamplerParameteri is called for a non-scalar parameter.");
		ctx.glSamplerParameteri(sampler, GL_TEXTURE_BORDER_COLOR, 0);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.endSection();
	}

	ctx.glDeleteSamplers(1, &sampler);
}